

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runstat.c
# Opt level: O1

void runstat(void)

{
  uchar uVar1;
  objnum obj;
  runsdef *prVar2;
  runcxdef *ctx;
  int state;
  int iVar3;
  
  runpprop(runctx,(uchar **)0x0,0,0,vocctx->voccxme,0xd,0,0,vocctx->voccxme);
  ctx = runctx;
  prVar2 = runctx->runcxsp;
  uVar1 = prVar2[-1].runstyp;
  runctx->runcxsp = prVar2 + -1;
  if (uVar1 != '\x02') {
    return;
  }
  if (prVar2[-1].runstyp == '\x02') {
    obj = prVar2[-1].runsv.runsvobj;
    outflushn(0);
    os_status(1);
    state = setmore(0);
    runpprop(runctx,(uchar **)0x0,0,0,obj,0x19,0,0,obj);
    iVar3 = os_get_status();
    if (iVar3 != 0) {
      outformat("\\n");
    }
    outflushn(0);
    setmore(state);
    os_status(0);
    return;
  }
  ctx->runcxerr->errcxptr->erraac = 0;
  runsign(ctx,0x3f2);
}

Assistant:

void runstat(void)
{
    objnum  locobj;
    int     savemoremode;

    /* get the location of the Me object */
    runppr(runctx, vocctx->voccxme, PRP_LOCATION, 0);

    /* if that's no an object, there's nothing we can do */
    if (runtostyp(runctx) != DAT_OBJECT)
    {
        rundisc(runctx);
        return;
    }

    /* get Me.location */
    locobj = runpopobj(runctx);

    /* flush any pending output */
    outflushn(0);

    /* switch to output display mode 1 (status line) */
    os_status(1);

    /* turn off MORE mode */
    savemoremode = setmore(0);

    /* call the statusLine method of the current room */
    runppr(runctx, locobj, PRP_STATUSLINE, 0);

    /* if we're in the status line, make sure the line gets flushed */
    if (os_get_status() != 0)
        tioputs(tioctx, "\\n");
    outflushn(0);

    /* restore the previous MORE mode */
    setmore(savemoremode);

    /* switch to output display mode 0 (main text area) */
    os_status(0);
}